

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedProcedure.cpp
# Opt level: O2

void __thiscall
slang::analysis::AnalyzedProcedure::AnalyzedProcedure
          (AnalyzedProcedure *this,AnalysisContext *context,Symbol *analyzedSymbol,
          AnalyzedProcedure *parentProcedure)

{
  vector<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  *this_00;
  TimingControl **__args_1;
  Path *pPVar1;
  StatementSyntax *pSVar2;
  ValueSymbol *pVVar3;
  bool bVar4;
  Statement *pSVar5;
  ClockingBlockSymbol *this_01;
  TimingControl *pTVar6;
  variant_alternative_t<1UL,_variant<const_Statement_*,_const_Expression_*>_> *ppEVar7;
  long lVar8;
  ulong uVar9;
  Type *this_02;
  Diagnostic *this_03;
  uint uVar10;
  DiagCode code;
  long lVar11;
  SubroutineSymbol *subroutine;
  pointer __v;
  EVP_PKEY_CTX *ctx;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *ctx_00;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this_04;
  SymbolLSPMap *this_05;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_06;
  pair<unsigned_long,_unsigned_long> pVar12;
  pair<unsigned_long,_unsigned_long> lbounds;
  Symbol *inst;
  Path local_d58;
  anon_class_24_3_ec3538fa local_d10;
  const_iterator lit;
  const_iterator local_cb8;
  DataFlowAnalysis dfa;
  
  (this->analyzedSymbol).ptr = analyzedSymbol;
  this->parentProcedure = parentProcedure;
  this_00 = &this->assertions;
  this->inferredClock = (TimingControl *)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertions).
  super__Vector_base<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataFlowAnalysis::DataFlowAnalysis(&dfa,context,analyzedSymbol,true);
  if (analyzedSymbol->kind == ProceduralBlock) {
    pSVar5 = ast::ProceduralBlockSymbol::getBody((ProceduralBlockSymbol *)analyzedSymbol);
  }
  else {
    pSVar5 = ast::SubroutineSymbol::getBody((SubroutineSymbol *)analyzedSymbol);
  }
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
            (&dfa.
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
             ,pSVar5);
  if (dfa.
      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>.
      super_FlowAnalysisBase.bad != false) goto LAB_0032310a;
  if (((parentProcedure != (AnalyzedProcedure *)0x0) ||
      (dfa.concurrentAssertions.
       super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
       .len != 0)) ||
     (dfa.sampledValueCalls.super_SmallVectorBase<const_slang::ast::CallExpression_*>.len != 0)) {
    __args_1 = &this->inferredClock;
    if ((analyzedSymbol->kind == ProceduralBlock) && (analyzedSymbol[1].kind != Root)) {
      pTVar6 = DataFlowAnalysis::inferClock(&dfa,parentProcedure);
      *__args_1 = pTVar6;
    }
    else {
      pTVar6 = *__args_1;
    }
    if (pTVar6 == (TimingControl *)0x0) {
      this_01 = (ClockingBlockSymbol *)
                ast::Compilation::getDefaultClocking
                          (analyzedSymbol->parentScope->compilation,analyzedSymbol->parentScope);
      if (this_01 != (ClockingBlockSymbol *)0x0) {
        pTVar6 = ast::ClockingBlockSymbol::getEvent(this_01);
        *__args_1 = pTVar6;
        goto LAB_00322d08;
      }
      pTVar6 = *__args_1;
      if (pTVar6 != (TimingControl *)0x0) goto LAB_00322d08;
    }
    else {
LAB_00322d08:
      if (pTVar6->kind == Invalid) goto LAB_0032310a;
    }
    for (__v = dfa.concurrentAssertions.
               super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
               .data_;
        __v != dfa.concurrentAssertions.
               super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
               .data_ + dfa.concurrentAssertions.
                        super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
                        .len; __v = __v + 1) {
      if ((__v == (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)0x0) ||
         ((__v->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
          super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
          super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
          super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
          super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
          super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
          ._M_index != '\0')) {
        ppEVar7 = std::get<1ul,slang::ast::Statement_const*,slang::ast::Expression_const*>(__v);
        inst = (Symbol *)this;
        std::
        vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
        ::
        emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure*,slang::ast::Symbol_const&,slang::ast::Expression_const&>
                  ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                    *)this_00,context,__args_1,(AnalyzedProcedure **)&inst,analyzedSymbol,*ppEVar7);
      }
      else {
        pSVar5 = *(Statement **)
                  &(__v->
                   super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                   ).
                   super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                   .
                   super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                   .
                   super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                   .
                   super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                   ._M_u;
        if (pSVar5->kind == ProceduralChecker) {
          lVar8 = *(long *)(pSVar5 + 1);
          pSVar2 = pSVar5[1].syntax;
          for (lVar11 = 0; (long)pSVar2 << 3 != lVar11; lVar11 = lVar11 + 8) {
            inst = *(Symbol **)(lVar8 + lVar11);
            std::
            vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
            ::
            emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,slang::ast::Symbol_const*&>
                      ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                        *)this_00,context,__args_1,this,pSVar5,&inst);
          }
        }
        else {
          inst = (Symbol *)0x0;
          std::
          vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
          ::
          emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,decltype(nullptr)>
                    ((vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
                      *)this_00,context,__args_1,this,pSVar5,&inst);
        }
      }
    }
    if (*__args_1 == (TimingControl *)0x0) {
      for (lVar8 = 0;
          dfa.sampledValueCalls.super_SmallVectorBase<const_slang::ast::CallExpression_*>.len << 3
          != lVar8; lVar8 = lVar8 + 8) {
        ClockInference::checkSampledValueFuncs
                  (context,analyzedSymbol,
                   *(Expression **)
                    ((long)dfa.sampledValueCalls.
                           super_SmallVectorBase<const_slang::ast::CallExpression_*>.data_ + lVar8))
        ;
      }
    }
  }
  if (analyzedSymbol->kind == Subroutine) {
    if ((dfa.
         super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
         .state.reachable == true) &&
       (*(int *)((long)&analyzedSymbol[2].originatingSyntax + 4) == 0)) {
      this_02 = ast::DeclaredType::getType((DeclaredType *)&analyzedSymbol[1].originatingSyntax);
      bVar4 = ast::Type::isVoid(this_02);
      if ((!bVar4) && ((analyzedSymbol->name)._M_len != 0)) {
        bVar4 = DataFlowAnalysis::isDefinitelyAssigned
                          (&dfa,(ValueSymbol *)analyzedSymbol[3].name._M_str);
        if (!bVar4) {
          code.subsystem = Analysis;
          code.code = 0x15;
          if (dfa.
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              .returnStates.super_SmallVectorBase<slang::analysis::DataFlowState>.len == 0) {
            bVar4 = DataFlowAnalysis::isReferenced
                              (&dfa,(ValueSymbol *)analyzedSymbol[3].name._M_str);
            code = (DiagCode)((uint)!bVar4 << 0x11 | 0x15000e);
          }
          this_03 = AnalysisContext::addDiag(context,analyzedSymbol,code,analyzedSymbol->location);
          Diagnostic::operator<<(this_03,analyzedSymbol->name);
        }
      }
    }
  }
  else if ((analyzedSymbol->kind == ProceduralBlock) && (analyzedSymbol[1].kind == CompilationUnit))
  {
    local_d10.dfa = &dfa;
    local_d10.context = context;
    local_d10.procedure = (ProceduralBlockSymbol *)analyzedSymbol;
    for (uVar9 = 0;
        uVar9 < dfa.lvalues.super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.
                len; uVar9 = uVar9 + 1) {
      pVVar3 = dfa.lvalues.super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.
               data_[uVar9].symbol.ptr;
      uVar10 = (pVVar3->super_Symbol).kind - Variable;
      if (((0x18 < uVar10) || ((0x1800c0fU >> (uVar10 & 0x1f) & 1) == 0)) ||
         (pVVar3[1].super_Symbol.kind != Unknown)) {
        this_05 = &dfa.lvalues.
                   super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                   [uVar9].assigned;
        if (uVar9 < dfa.
                    super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                    .state.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    len) {
          this_06 = dfa.
                    super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                    .state.assigned.
                    super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                    data_ + uVar9;
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin(&lit,this_05);
          while( true ) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                      ((const_iterator *)&inst,this_05);
            ctx_00 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_d58;
            bVar4 = IntervalMapDetails::Path::operator==(&lit.path,&local_d58);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_d58,
                       (EVP_PKEY_CTX *)ctx_00);
            if (bVar4) break;
            lbounds = IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator
                      ::bounds(&lit);
            IntervalMap<unsigned_long,_std::monostate,_3U>::find
                      ((overlap_iterator *)&inst,this_06,&lbounds);
            IntervalMap<unsigned_long,_std::monostate,_3U>::end(&local_cb8,this_06);
            pPVar1 = &local_cb8.path;
            ctx = (EVP_PKEY_CTX *)pPVar1;
            bVar4 = IntervalMapDetails::Path::operator==(&local_d58,pPVar1);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar1,ctx);
            if (bVar4) {
LAB_00322f4c:
              SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                        ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_d58,ctx);
              lVar8 = 0x50;
              if ((lit.map)->height != 0) {
                lVar8 = 0x80;
              }
              AnalyzedProcedure::anon_class_24_3_ec3538fa::operator()
                        (&local_d10,
                         *(Symbol **)
                          ((long)(lit.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  data_ + -1)
                                 [lit.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len]
                                 .node +
                          (ulong)(lit.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  data_ + -1)
                                 [lit.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len]
                                 .offset * 8 + lVar8),
                         (Expression *)
                         (lit.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len * 0x10))
              ;
            }
            else {
              pVar12 = IntervalMap<unsigned_long,_std::monostate,_3U>::const_iterator::bounds
                                 ((const_iterator *)&inst);
              if ((lbounds.first < pVar12.first) || (pVar12.second < lbounds.second))
              goto LAB_00322f4c;
              SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                        ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_d58,ctx);
            }
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
            operator++(&lit);
          }
          this_04 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&lit.path;
        }
        else {
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::begin
                    ((const_iterator *)&inst,this_05);
          while( true ) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end(&lit,this_05);
            pPVar1 = &lit.path;
            ctx_00 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar1;
            bVar4 = IntervalMapDetails::Path::operator==(&local_d58,pPVar1);
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)pPVar1,
                       (EVP_PKEY_CTX *)ctx_00);
            if (bVar4) break;
            lVar8 = 0x50;
            if (*(int *)&inst[1].originatingSyntax != 0) {
              lVar8 = 0x80;
            }
            AnalyzedProcedure::anon_class_24_3_ec3538fa::operator()
                      (&local_d10,
                       *(Symbol **)
                        ((long)(local_d58.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                               + -1)[local_d58.path.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     len].node +
                        (ulong)(local_d58.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                               + -1)[local_d58.path.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     len].offset * 8 + lVar8),
                       (Expression *)
                       (local_d58.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                        .len * 0x10));
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
            operator++((const_iterator *)&inst);
          }
          this_04 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_d58;
        }
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
                  (this_04,(EVP_PKEY_CTX *)ctx_00);
      }
    }
  }
LAB_0032310a:
  DataFlowAnalysis::~DataFlowAnalysis(&dfa);
  return;
}

Assistant:

AnalyzedProcedure::AnalyzedProcedure(AnalysisContext& context, const Symbol& analyzedSymbol,
                                     const AnalyzedProcedure* parentProcedure) :
    analyzedSymbol(&analyzedSymbol), parentProcedure(parentProcedure) {

    DataFlowAnalysis dfa(context, analyzedSymbol, true);
    switch (analyzedSymbol.kind) {
        case SymbolKind::ProceduralBlock:
            dfa.run(analyzedSymbol.as<ProceduralBlockSymbol>().getBody());
            break;
        case SymbolKind::Subroutine:
            dfa.run(analyzedSymbol.as<SubroutineSymbol>().getBody());
            break;
        default:
            SLANG_UNREACHABLE;
    }

    if (dfa.bad)
        return;

    if (parentProcedure || !dfa.getAssertions().empty() || !dfa.getSampledValueCalls().empty()) {
        // All flavors of always and initial blocks can infer a clock.
        if (analyzedSymbol.kind == SymbolKind::ProceduralBlock &&
            analyzedSymbol.as<ProceduralBlockSymbol>().procedureKind !=
                ProceduralBlockKind::Final) {
            inferredClock = dfa.inferClock(parentProcedure);
        }

        // If no procedural inferred clock, check the scope for a default clocking block.
        if (!inferredClock) {
            auto scope = analyzedSymbol.getParentScope();
            SLANG_ASSERT(scope);

            if (auto defaultClocking = scope->getCompilation().getDefaultClocking(*scope))
                inferredClock = &defaultClocking->as<ClockingBlockSymbol>().getEvent();
        }

        if (inferredClock && inferredClock->bad())
            return;

        for (auto& var : dfa.getAssertions()) {
            if (auto stmtPtr = std::get_if<const Statement*>(&var)) {
                auto& stmt = **stmtPtr;
                if (stmt.kind == StatementKind::ProceduralChecker) {
                    for (auto inst : stmt.as<ProceduralCheckerStatement>().instances)
                        assertions.emplace_back(context, inferredClock, *this, stmt, inst);
                }
                else {
                    assertions.emplace_back(context, inferredClock, *this, stmt, nullptr);
                }
            }
            else {
                auto& expr = *std::get<const Expression*>(var);
                assertions.emplace_back(context, inferredClock, this, analyzedSymbol, expr);
            }
        }

        // If we have no inferred clock then all sampled value system calls must provide
        // a clocking argument explicitly.
        if (!inferredClock) {
            for (auto call : dfa.getSampledValueCalls())
                ClockInference::checkSampledValueFuncs(context, analyzedSymbol, *call);
        }
    }

    if (analyzedSymbol.kind == SymbolKind::ProceduralBlock) {
        auto& procedure = analyzedSymbol.as<ProceduralBlockSymbol>();
        if (procedure.procedureKind == ProceduralBlockKind::AlwaysComb) {
            dfa.visitLatches([&](const Symbol&, const Expression& expr) {
                FormatBuffer buffer;
                stringifyLSP(expr, dfa.getEvalContext(), buffer);

                context.addDiag(procedure, diag::InferredLatch, expr.sourceRange) << buffer.str();
            });
        }
    }
    else if (analyzedSymbol.kind == SymbolKind::Subroutine) {
        // Diagnose missing return statements and/or incomplete
        // assignments to the return value var.
        auto& subroutine = analyzedSymbol.as<SubroutineSymbol>();
        if (dfa.isReachable() && subroutine.subroutineKind == SubroutineKind::Function &&
            !subroutine.getReturnType().isVoid() && !subroutine.name.empty()) {

            // Control falls off the end of a non-void function but that is
            // fine if the return value var is definitely assigned here.
            SLANG_ASSERT(subroutine.returnValVar);
            if (!dfa.isDefinitelyAssigned(*subroutine.returnValVar)) {
                if (dfa.hasReturnStatements() || dfa.isReferenced(*subroutine.returnValVar)) {
                    context.addDiag(subroutine, diag::IncompleteReturn, subroutine.location)
                        << subroutine.name;
                }
                else {
                    context.addDiag(subroutine, diag::MissingReturn, subroutine.location)
                        << subroutine.name;
                }
            }
        }
    }
}